

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map_checked.hh
# Opt level: O2

void __thiscall
doublechecked::Roaring64Map::Roaring64Map(Roaring64Map *this,Roaring64Map *other_plain)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  Roaring64Map *__range2;
  value_type value;
  Roaring64MapSetBitBiDirectionalIterator __begin2;
  Roaring64MapSetBitBiDirectionalIterator __end2;
  unsigned_long local_a0;
  Roaring64MapSetBitBiDirectionalIterator local_98;
  Roaring64MapSetBitBiDirectionalIterator local_60;
  
  p_Var1 = &(this->plain).roarings._M_t._M_impl.super__Rb_tree_header;
  *(undefined8 *)&(this->plain).roarings._M_t._M_impl = 0;
  *(undefined8 *)&(this->plain).roarings._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->plain).roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->plain).roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->plain).roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->plain).roarings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->plain).copyOnWrite = false;
  p_Var1 = &(this->check)._M_t._M_impl.super__Rb_tree_header;
  (this->check)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->check)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->check)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->check)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->check)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  roaring::Roaring64Map::operator=(&this->plain,other_plain);
  roaring::Roaring64Map::begin(&local_98,&this->plain);
  roaring::Roaring64Map::end(&local_60,&this->plain);
  while( true ) {
    bVar2 = roaring::Roaring64MapSetBitBiDirectionalIterator::operator!=(&local_98,&local_60);
    if (!bVar2) break;
    local_a0 = CONCAT44(local_98.map_iter._M_node[1]._M_color,local_98.i.current_value);
    std::
    _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
    ::_M_insert_unique<unsigned_long_const&>
              ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                *)&this->check,&local_a0);
    roaring::Roaring64MapSetBitBiDirectionalIterator::operator++(&local_98);
  }
  return;
}

Assistant:

Roaring64Map(roaring::Roaring64Map &&other_plain) {
        plain = std::move(other_plain);
        for (auto value : plain) check.insert(value);
    }